

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

int main(int argc,char **argv)

{
  int iVar1;
  PureArrayFactory *this;
  undefined4 extraout_var;
  long *plVar3;
  long *plVar4;
  long *plVar5;
  long *plVar6;
  long *plVar7;
  long *plVar2;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  
  this = (PureArrayFactory *)operator_new(0x20);
  PureArrayFactory::PureArrayFactory(this,10,7,3);
  iVar1 = (*this->_vptr_PureArrayFactory[2])(this,1);
  plVar2 = (long *)CONCAT44(extraout_var,iVar1);
  iVar1 = (*this->_vptr_PureArrayFactory[2])(this,2);
  plVar3 = (long *)CONCAT44(extraout_var_00,iVar1);
  iVar1 = (*this->_vptr_PureArrayFactory[2])(this,3);
  plVar4 = (long *)CONCAT44(extraout_var_01,iVar1);
  iVar1 = (*this->_vptr_PureArrayFactory[2])(this,1);
  plVar5 = (long *)CONCAT44(extraout_var_02,iVar1);
  iVar1 = (*this->_vptr_PureArrayFactory[2])(this,2);
  plVar6 = (long *)CONCAT44(extraout_var_03,iVar1);
  iVar1 = (*this->_vptr_PureArrayFactory[2])(this,3);
  plVar7 = (long *)CONCAT44(extraout_var_04,iVar1);
  if (plVar2 != (long *)0x0) {
    (**(code **)(*plVar2 + 0x20))(plVar2);
  }
  if (plVar3 != (long *)0x0) {
    (**(code **)(*plVar3 + 0x20))(plVar3);
  }
  if (plVar4 != (long *)0x0) {
    (**(code **)(*plVar4 + 0x20))(plVar4);
  }
  if (plVar5 != (long *)0x0) {
    (**(code **)(*plVar5 + 0x20))(plVar5);
  }
  if (plVar6 != (long *)0x0) {
    (**(code **)(*plVar6 + 0x20))(plVar6);
  }
  if (plVar7 != (long *)0x0) {
    (**(code **)(*plVar7 + 0x20))(plVar7);
  }
  return 0;
}

Assistant:

int main(int argc, char** argv)
{
	PureArrayFactory *factory = new PureArrayFactory(10, 7, 3);

	Array *a1 = factory->getPureArray(1);
	Array *a2 = factory->getPureArray(2);
	Array *a3 = factory->getPureArray(3);
	Array *a4 = factory->getPureArray(1);
	Array *a5 = factory->getPureArray(2);
	Array *a6 = factory->getPureArray(3);

	if (a1)
		a1->printArray();

	if (a2)
		a2->printArray();

	if (a3)
		a3->printArray();

	if (a4)
		a4->printArray();

	if (a5)
		a5->printArray();

	if (a6)
		a6->printArray();

	return 0;
}